

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O3

double __thiscall IF97::Region3::deltatau_d2phi_ddelta_dtau(Region3 *this,double T,double rho)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  size_t i;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar6 = 0.0;
  lVar5 = 1;
  do {
    uVar1 = (this->Ir).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[lVar5];
    dVar7 = 1.0;
    if (uVar1 != 0) {
      uVar2 = -uVar1;
      if (0 < (int)uVar1) {
        uVar2 = uVar1;
      }
      dVar8 = 1.0 / (rho / 322.0);
      if (-1 < (int)uVar1) {
        dVar8 = rho / 322.0;
      }
      dVar7 = 1.0;
      do {
        if ((uVar2 & 1) != 0) {
          dVar7 = dVar7 * dVar8;
        }
        dVar8 = dVar8 * dVar8;
        bVar3 = 1 < uVar2;
        uVar2 = uVar2 >> 1;
      } while (bVar3);
    }
    uVar2 = (this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[lVar5];
    dVar8 = 1.0;
    if (uVar2 != 0) {
      uVar4 = -uVar2;
      if (0 < (int)uVar2) {
        uVar4 = uVar2;
      }
      dVar9 = 1.0 / (647.096 / T);
      if (-1 < (int)uVar2) {
        dVar9 = 647.096 / T;
      }
      dVar8 = 1.0;
      do {
        if ((uVar4 & 1) != 0) {
          dVar8 = dVar8 * dVar9;
        }
        dVar9 = dVar9 * dVar9;
        bVar3 = 1 < uVar4;
        uVar4 = uVar4 >> 1;
      } while (bVar3);
    }
    dVar6 = dVar6 + (double)(int)uVar1 *
                    (double)(int)uVar2 *
                    (this->nr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar5] * dVar7 * dVar8;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x28);
  return dVar6;
}

Assistant:

double deltatau_d2phi_ddelta_dtau(double T, double rho) const{
            const double delta = rho/Rhocrit, tau = Tcrit/T;
            double summer = 0;
            for (std::size_t i = 1; i < 40; ++i){
                summer += nr[i]*Jr[i]*Ir[i]*powi(delta, Ir[i])*powi(tau, Jr[i]);
            }
            return summer;
        }